

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_pmon_mips64(CPUMIPSState_conflict5 *env,int function)

{
  int iVar1;
  
  iVar1 = function / 2;
  if (iVar1 < 0xb) {
    if (iVar1 != 2) {
      if (iVar1 != 3) {
        return;
      }
      goto LAB_008d6eb6;
    }
    if ((env->active_tc).gpr[4] == 0) {
      (env->active_tc).gpr[2] = 0xffffffffffffffff;
    }
  }
  else if (iVar1 != 0xb) {
    if (iVar1 != 0xc) {
      if (iVar1 != 0x9e) {
        return;
      }
      printf("%s",(env->active_tc).gpr[4]);
      return;
    }
LAB_008d6eb6:
    putchar((int)(char)(env->active_tc).gpr[4]);
    return;
  }
  (env->active_tc).gpr[2] = 0xffffffffffffffff;
  return;
}

Assistant:

void helper_pmon(CPUMIPSState *env, int function)
{
    function /= 2;
    switch (function) {
    case 2: /* TODO: char inbyte(int waitflag); */
        if (env->active_tc.gpr[4] == 0) {
            env->active_tc.gpr[2] = -1;
        }
        /* Fall through */
    case 11: /* TODO: char inbyte (void); */
        env->active_tc.gpr[2] = -1;
        break;
    case 3:
    case 12:
        printf("%c", (char)(env->active_tc.gpr[4] & 0xFF));
        break;
    case 17:
        break;
    case 158:
        {
            unsigned char *fmt = (void *)(uintptr_t)env->active_tc.gpr[4];
            printf("%s", fmt);
        }
        break;
    }
}